

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.h
# Opt level: O2

void __thiscall
pbrt::GaussianFilter::GaussianFilter
          (GaussianFilter *this,Vector2f *radius,Float sigma,Allocator alloc)

{
  Float FVar1;
  FilterHandle local_20;
  
  (this->radius).super_Tuple2<pbrt::Vector2,_float> = radius->super_Tuple2<pbrt::Vector2,_float>;
  this->sigma = sigma;
  FVar1 = Gaussian((radius->super_Tuple2<pbrt::Vector2,_float>).x,0.0,sigma);
  this->expX = FVar1;
  FVar1 = Gaussian((radius->super_Tuple2<pbrt::Vector2,_float>).y,0.0,sigma);
  this->expY = FVar1;
  local_20.
  super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  .bits = (TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
           )((ulong)this | 0x2000000000000);
  FilterSampler::FilterSampler(&this->sampler,&local_20,alloc);
  return;
}

Assistant:

GaussianFilter(const Vector2f &radius, Float sigma = 0.5f, Allocator alloc = {})
        : radius(radius),
          sigma(sigma),
          expX(Gaussian(radius.x, 0, sigma)),
          expY(Gaussian(radius.y, 0, sigma)),
          sampler(this, alloc) {}